

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsDoubleToNumber(double dbl,JsValueRef *asValue)

{
  ScriptContext *scriptContext;
  bool bVar1;
  JsrtContext *pJVar2;
  Var pvVar3;
  JsErrorCode JVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_38;
  double local_28;
  
  if (asValue == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    local_28 = dbl;
    bVar1 = Js::JavascriptNumber::TryToVarFastWithCheck(dbl,asValue);
    JVar4 = JsNoError;
    if (!bVar1) {
      local_38.m_actionEvent = (EventLogEntry *)0x0;
      local_38.m_resultPtr = (TTDVar *)0x0;
      pJVar2 = JsrtContext::GetCurrent();
      JVar4 = JsErrorNoCurrentContext;
      if (pJVar2 != (JsrtContext *)0x0) {
        scriptContext =
             (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        uVar5 = SUB84(local_28,0);
        uVar6 = (undefined4)((ulong)local_28 >> 0x20);
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordJsRTCreateNumber
                    (scriptContext->threadContext->TTDLog,&local_38,local_28);
          uVar5 = SUB84(local_28,0);
          uVar6 = (undefined4)((ulong)local_28 >> 0x20);
        }
        pvVar3 = Js::JavascriptNumber::ToVarNoCheck((double)CONCAT44(uVar6,uVar5),scriptContext);
        *asValue = pvVar3;
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          if (local_38.m_resultPtr == (TTDVar *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          *local_38.m_resultPtr = pvVar3;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
        JVar4 = JsNoError;
      }
      if (local_38.m_actionEvent != (EventLogEntry *)0x0) {
        if ((local_38.m_actionEvent)->ResultStatus != -1) {
          TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
        }
        (local_38.m_actionEvent)->ResultStatus = JVar4;
      }
    }
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsDoubleToNumber(_In_ double dbl, _Out_ JsValueRef *asValue)
{
    PARAM_NOT_NULL(asValue);
    //If number is not heap allocated then we don't need to record/track the creation for time-travel
    if (Js::JavascriptNumber::TryToVarFastWithCheck(dbl, asValue))
    {
      return JsNoError;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateNumber, dbl);

        *asValue = Js::JavascriptNumber::ToVarNoCheck(dbl, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, asValue);

        return JsNoError;
    });
}